

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this,char *filename)

{
  bool bVar1;
  int iVar2;
  cmListFileLexer_BOM bom;
  allocator<char> local_2d;
  cmListFileLexer_BOM local_2c;
  string local_28;
  
  this->FileName = filename;
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,filename,&local_2c);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"cmListFileCache: error can not open file.",&local_2d);
    IssueFileOpenError(this,&local_28);
  }
  else if (local_2c == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"Error while reading Byte-Order-Mark. File not seekable?",
               &local_2d);
    IssueFileOpenError(this,&local_28);
  }
  else {
    if ((local_2c & ~cmListFileLexer_BOM_UTF8) == cmListFileLexer_BOM_None) {
      bVar1 = Parse(this);
      return bVar1;
    }
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"File starts with a Byte-Order-Mark that is not UTF-8.",&local_2d
              );
    IssueFileOpenError(this,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool cmListFileParser::ParseFile(const char* filename)
{
  this->FileName = filename;

#ifdef _WIN32
  std::string expandedFileName = cmsys::Encoding::ToNarrow(
    cmSystemTools::ConvertToWindowsExtendedPath(filename));
  filename = expandedFileName.c_str();
#endif

  // Open the file.
  cmListFileLexer_BOM bom;
  if (!cmListFileLexer_SetFileName(this->Lexer, filename, &bom)) {
    this->IssueFileOpenError("cmListFileCache: error can not open file.");
    return false;
  }

  if (bom == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError("Error while reading Byte-Order-Mark. "
                             "File not seekable?");
    return false;
  }

  // Verify the Byte-Order-Mark, if any.
  if (bom != cmListFileLexer_BOM_None && bom != cmListFileLexer_BOM_UTF8) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError(
      "File starts with a Byte-Order-Mark that is not UTF-8.");
    return false;
  }

  return this->Parse();
}